

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGridHeader.cpp
# Opt level: O2

void PatternGridHeaderTU::drawPlus(QPainter *painter,int xpos,QColor *color)

{
  QPainter::fillRect(painter,xpos + 5,0xc,2,8,color);
  QPainter::fillRect(painter,xpos + 2,0xf,8,2,color);
  return;
}

Assistant:

void drawPlus(QPainter &painter, int xpos, QColor const& color) {
    // vertical
    painter.fillRect(
        xpos + PM_VPAD + PM_CENTER,
        PLUS_START_Y + PM_HPAD,
        PM_THICKNESS,
        PM_LENGTH,
        color
    );
    // horizontal
    painter.fillRect(
        xpos + PM_VPAD,
        PLUS_START_Y + PM_HPAD + PM_CENTER,
        PM_LENGTH,
        PM_THICKNESS,
        color
    );
}